

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.hpp
# Opt level: O1

span<int,_18446744073709551615UL> __thiscall
nonstd::span_lite::span<int,_18446744073709551615UL>::last
          (span<int,_18446744073709551615UL> *this,size_type count)

{
  contract_violation *this_00;
  span<int,_18446744073709551615UL> local_20;
  
  if (count <= this->size_) {
    span<int_*,_0>(&local_20,this->data_ + (this->size_ - count),count);
    return local_20;
  }
  this_00 = (contract_violation *)__cxa_allocate_exception(0x10);
  detail::contract_violation::contract_violation
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/martinmoene[P]span-lite/include/nonstd/span.hpp:1198: Precondition violation."
            );
  __cxa_throw(this_00,&detail::contract_violation::typeinfo,std::logic_error::~logic_error);
}

Assistant:

span_constexpr_exp span< element_type, dynamic_extent >
    last( size_type count ) const
    {
        span_EXPECTS( detail::is_positive( count ) && count <= size() );

        return span< element_type, dynamic_extent >( data() + ( size() - count ), count );
    }